

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

char * cmExpandVariablesInString(void *arg,char *source,int escapeQuotes,int atOnly)

{
  char *pcVar1;
  string *result;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string barf;
  cmMakefile *mf;
  int atOnly_local;
  int escapeQuotes_local;
  char *source_local;
  void *arg_local;
  
  barf.field_2._8_8_ = arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,source,&local_49);
  std::allocator<char>::~allocator(&local_49);
  cmMakefile::ExpandVariablesInString
            ((cmMakefile *)barf.field_2._8_8_,(string *)local_48,escapeQuotes != 0,atOnly != 0,false
             ,(char *)0x0,-1,false,false);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  std::__cxx11::string::~string((string *)local_48);
  return pcVar1;
}

Assistant:

static char CCONV* cmExpandVariablesInString(void* arg, const char* source,
                                             int escapeQuotes, int atOnly)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::string barf = source;
  std::string const& result =
    mf->ExpandVariablesInString(barf, escapeQuotes != 0, atOnly != 0);
  return strdup(result.c_str());
}